

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha224.c
# Opt level: O0

int SHA256Input(SHA256Context *context,uint8_t *message_array,uint length)

{
  uint8_t uVar1;
  short sVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  bool bVar6;
  int local_20;
  uint32_t addTemp;
  int result;
  uint length_local;
  uint8_t *message_array_local;
  SHA256Context *context_local;
  
  if (length == 0) {
    local_20 = 0;
  }
  else if ((context == (SHA256Context *)0x0) || (message_array == (uint8_t *)0x0)) {
    local_20 = 1;
  }
  else if (context->Computed == 0) {
    addTemp = length;
    _result = message_array;
    if (context->Corrupted == 0) {
      while( true ) {
        bVar6 = false;
        if (addTemp != 0) {
          bVar6 = context->Corrupted == 0;
        }
        if (!bVar6) break;
        if (context->Message_Block_Index < 0x40) {
          uVar1 = *_result;
          sVar2 = context->Message_Block_Index;
          context->Message_Block_Index = sVar2 + 1;
          context->Message_Block[sVar2] = uVar1;
          uVar3 = context->Length_Low;
          uVar5 = context->Length_Low + 8;
          context->Length_Low = uVar5;
          bVar6 = false;
          if (uVar5 < uVar3) {
            uVar4 = context->Length_High + 1;
            context->Length_High = uVar4;
            bVar6 = uVar4 == 0;
          }
          context->Corrupted = (uint)bVar6;
          if ((bVar6 == 0) && (context->Message_Block_Index == 0x40)) {
            SHA224_256ProcessMessageBlock(context);
          }
          _result = _result + 1;
          addTemp = addTemp - 1;
        }
        else {
          context->Corrupted = 4;
          addTemp = addTemp - 1;
        }
      }
      local_20 = context->Corrupted;
    }
    else {
      local_20 = context->Corrupted;
    }
  }
  else {
    context->Corrupted = 3;
    local_20 = 3;
  }
  return local_20;
}

Assistant:

int SHA256Input(SHA256Context *context, const uint8_t *message_array, unsigned int length)
{
    int result;
    uint32_t addTemp;
    if (!length)
    {
        result = shaSuccess;
    }
    else if (!context || !message_array)
    {
        result = shaNull;
    }
    else if (context->Computed)
    {
        result = context->Corrupted = shaStateError;
    }
    else if (context->Corrupted)
    {
        result = context->Corrupted;
    }
    else
    {
        while (length-- && !context->Corrupted)
        {
            if (context->Message_Block_Index < SHA256_Message_Block_Size)
            {
                context->Message_Block[context->Message_Block_Index++] = (*message_array & 0xFF);

                if (!SHA224_256AddLength(context, 8) && (context->Message_Block_Index == SHA256_Message_Block_Size))
                {
                    SHA224_256ProcessMessageBlock(context);
                }
                message_array++;
            }
            else
            {
                result = context->Corrupted = shaBadParam;
            }
        }
        result = context->Corrupted;
    }
    return result;
}